

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void Discover(void)

{
  sockaddr *psVar1;
  bool bVar2;
  int iVar3;
  ifaddrs *piVar4;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  char (*in_stack_ffffffffffffff78) [9];
  ifaddrs *myaddrs;
  _Alloc_hider in_stack_ffffffffffffff88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((fDiscover) && (iVar3 = getifaddrs(&myaddrs), iVar3 == 0)) {
    if (myaddrs == (ifaddrs *)0x0) {
      myaddrs = (ifaddrs *)0x0;
    }
    else {
      piVar4 = myaddrs;
      do {
        psVar1 = piVar4->ifa_addr;
        if ((psVar1 != (sockaddr *)0x0) && ((piVar4->ifa_flags & 9) == 1)) {
          if (psVar1->sa_family == 10) {
            CNetAddr::CNetAddr((CNetAddr *)&local_58,(in6_addr *)(psVar1->sa_data + 6),0);
            bVar2 = AddLocal((CNetAddr *)&local_58,1);
            if (bVar2) {
              CNetAddr::ToStringAddr_abi_cxx11_
                        ((string *)&stack0xffffffffffffff88,(CNetAddr *)&local_58);
              source_file_00._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file_00._M_len = 0x50;
              logging_function_00._M_str = "Discover";
              logging_function_00._M_len = 8;
              LogPrintf_<char[9],char*,std::__cxx11::string>
                        (logging_function_00,source_file_00,0xc4e,
                         IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|RAND|REINDEX|WALLETDB|BENCH|HTTP,
                         (int)piVar4 + 8,(char *)&stack0xffffffffffffff88,in_stack_ffffffffffffff78,
                         (char **)myaddrs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff88._M_p);
LAB_008cc5d0:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)in_stack_ffffffffffffff88._M_p != &local_68) {
                operator_delete(in_stack_ffffffffffffff88._M_p,local_68._M_allocated_capacity + 1);
              }
            }
          }
          else {
            if (psVar1->sa_family != 2) goto LAB_008cc5f8;
            CNetAddr::CNetAddr((CNetAddr *)&local_58,(in_addr *)(psVar1->sa_data + 2));
            bVar2 = AddLocal((CNetAddr *)&local_58,1);
            if (bVar2) {
              CNetAddr::ToStringAddr_abi_cxx11_
                        ((string *)&stack0xffffffffffffff88,(CNetAddr *)&local_58);
              source_file._M_str =
                   "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp"
              ;
              source_file._M_len = 0x50;
              logging_function._M_str = "Discover";
              logging_function._M_len = 8;
              LogPrintf_<char[9],char*,std::__cxx11::string>
                        (logging_function,source_file,0xc47,
                         IPC|I2P|VALIDATION|LEVELDB|QT|LIBEVENT|RAND|REINDEX|WALLETDB|MEMPOOL|TOR|
                         NET,(int)piVar4 + 8,(char *)&stack0xffffffffffffff88,
                         in_stack_ffffffffffffff78,(char **)myaddrs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_ffffffffffffff88._M_p);
              goto LAB_008cc5d0;
            }
          }
          if (0x10 < local_48) {
            free((void *)local_58._M_allocated_capacity);
          }
        }
LAB_008cc5f8:
        piVar4 = piVar4->ifa_next;
      } while (piVar4 != (ifaddrs *)0x0);
    }
    freeifaddrs(myaddrs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Discover()
{
    if (!fDiscover)
        return;

#ifdef WIN32
    // Get local host IP
    char pszHostName[256] = "";
    if (gethostname(pszHostName, sizeof(pszHostName)) != SOCKET_ERROR)
    {
        const std::vector<CNetAddr> addresses{LookupHost(pszHostName, 0, true)};
        for (const CNetAddr& addr : addresses)
        {
            if (AddLocal(addr, LOCAL_IF))
                LogPrintf("%s: %s - %s\n", __func__, pszHostName, addr.ToStringAddr());
        }
    }
#elif (HAVE_DECL_GETIFADDRS && HAVE_DECL_FREEIFADDRS)
    // Get local host ip
    struct ifaddrs* myaddrs;
    if (getifaddrs(&myaddrs) == 0)
    {
        for (struct ifaddrs* ifa = myaddrs; ifa != nullptr; ifa = ifa->ifa_next)
        {
            if (ifa->ifa_addr == nullptr) continue;
            if ((ifa->ifa_flags & IFF_UP) == 0) continue;
            if ((ifa->ifa_flags & IFF_LOOPBACK) != 0) continue;
            if (ifa->ifa_addr->sa_family == AF_INET)
            {
                struct sockaddr_in* s4 = (struct sockaddr_in*)(ifa->ifa_addr);
                CNetAddr addr(s4->sin_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv4 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
            else if (ifa->ifa_addr->sa_family == AF_INET6)
            {
                struct sockaddr_in6* s6 = (struct sockaddr_in6*)(ifa->ifa_addr);
                CNetAddr addr(s6->sin6_addr);
                if (AddLocal(addr, LOCAL_IF))
                    LogPrintf("%s: IPv6 %s: %s\n", __func__, ifa->ifa_name, addr.ToStringAddr());
            }
        }
        freeifaddrs(myaddrs);
    }
#endif
}